

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElfFile.cpp
# Opt level: O2

int __thiscall ElfFile::findSegmentlessSection(ElfFile *this,string *name)

{
  pointer ppEVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  bool bVar4;
  long lVar5;
  
  ppEVar1 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl
            .super__Vector_impl_data._M_finish;
  ppEVar2 = (this->segmentlessSections).
            super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  ppEVar3 = (this->sections).super__Vector_base<ElfSection_*,_std::allocator<ElfSection_*>_>._M_impl
            .super__Vector_impl_data._M_start;
  lVar5 = 0;
  while( true ) {
    if ((int)((ulong)((long)ppEVar1 - (long)ppEVar3) >> 3) <= lVar5) {
      return -1;
    }
    bVar4 = stringEqualInsensitive(name,&ppEVar2[lVar5]->name);
    if (bVar4) break;
    lVar5 = lVar5 + 1;
  }
  return (int)lVar5;
}

Assistant:

int ElfFile::findSegmentlessSection(const std::string& name)
{
	for (int i = 0; i < (int)sections.size(); i++)
	{
		if (stringEqualInsensitive(name,segmentlessSections[i]->getName()))
			return i;
	}

	return -1;
}